

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteBool(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
            *this,bool b)

{
  bool b_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  if (b) {
    PutReserve<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,4);
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'t');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'r');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'u');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'e');
  }
  else {
    PutReserve<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,5);
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'f');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'a');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'l');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'s');
    PutUnsafe<rapidjson::UTF8<char>,rapidjson::CrtAllocator>(this->os_,'e');
  }
  return true;
}

Assistant:

bool WriteBool(bool b)  {
        if (b) {
            PutReserve(*os_, 4);
            PutUnsafe(*os_, 't'); PutUnsafe(*os_, 'r'); PutUnsafe(*os_, 'u'); PutUnsafe(*os_, 'e');
        }
        else {
            PutReserve(*os_, 5);
            PutUnsafe(*os_, 'f'); PutUnsafe(*os_, 'a'); PutUnsafe(*os_, 'l'); PutUnsafe(*os_, 's'); PutUnsafe(*os_, 'e');
        }
        return true;
    }